

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_proto_fileName(JSContext *ctx,JSValue this_val)

{
  JSValue val;
  JSContext *ctx_00;
  int64_t in_RDI;
  JSFunctionBytecode *b;
  JSAtom in_stack_ffffffffffffffcc;
  JSValueUnion in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  val.tag = in_RDI;
  val.u.float64 = in_stack_ffffffffffffffd0.float64;
  ctx_00 = (JSContext *)JS_GetFunctionBytecode(val);
  if ((ctx_00 == (JSContext *)0x0) ||
     (((byte)((ushort)*(undefined2 *)((long)&ctx_00->rt + 1) >> 10) & 1) == 0)) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 3;
  }
  else {
    _local_10 = JS_AtomToString(ctx_00,in_stack_ffffffffffffffcc);
  }
  return _local_10;
}

Assistant:

static JSValue js_function_proto_fileName(JSContext *ctx,
                                          JSValueConst this_val)
{
    JSFunctionBytecode *b = JS_GetFunctionBytecode(this_val);
    if (b && b->has_debug) {
        return JS_AtomToString(ctx, b->debug.filename);
    }
    return JS_UNDEFINED;
}